

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

bool __thiscall EmmyFacade::PipeListen(EmmyFacade *this,lua_State *L,string *name,string *err)

{
  int iVar1;
  shared_ptr<PipelineServerTransporter> p;
  
  Destroy(this);
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffd0,
             (lua_State *)&this->_emmyDebuggerManager);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  (*lua_sethook)(L,ReadyLuaHook,7,0);
  std::make_shared<PipelineServerTransporter>();
  std::__shared_ptr<Transporter,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Transporter,(__gnu_cxx::_Lock_policy)2> *)&this->transporter,
             &p.super___shared_ptr<PipelineServerTransporter,_(__gnu_cxx::_Lock_policy)2>);
  iVar1 = PipelineServerTransporter::pipe
                    (p.super___shared_ptr<PipelineServerTransporter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(int *)name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<PipelineServerTransporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return SUB41(iVar1,0);
}

Assistant:

bool EmmyFacade::PipeListen(lua_State *L, const std::string &name, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto p = std::make_shared<PipelineServerTransporter>();
	transporter = p;
	// p->SetHandler(shared_from_this());
	const auto suc = p->pipe(name, err);
	return suc;
}